

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

bool __thiscall SQClass::Get(SQClass *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQString *pSVar1;
  bool bVar2;
  SQClassMember *pSVar3;
  SQObjectPtr *in_RDX;
  SQTable *in_RSI;
  long in_RDI;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_ffffffffffffffc8;
  SQSharedState *obj;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  SQTable *this_00;
  SQObjectPtr *in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar2 = SQTable::Get(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
  if (bVar2) {
    if (((in_RDX->super_SQObject)._unVal.nInteger & 0x2000000U) == 0) {
      sqvector<SQClassMember>::operator[]
                ((sqvector<SQClassMember> *)(in_RDI + 0x58),
                 (in_RDX->super_SQObject)._unVal.nInteger & 0xffffff);
      ::SQObjectPtr::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    else {
      pSVar3 = sqvector<SQClassMember>::operator[]
                         ((sqvector<SQClassMember> *)(in_RDI + 0x40),
                          (in_RDX->super_SQObject)._unVal.nInteger & 0xffffff);
      if ((pSVar3->val).super_SQObject._type == OT_WEAKREF) {
        pSVar1 = (pSVar3->val).super_SQObject._unVal.pString;
        obj = pSVar1->_sharedstate;
        this_00 = (SQTable *)pSVar1->_next;
      }
      else {
        obj = *(SQSharedState **)&(pSVar3->val).super_SQObject;
        this_00 = (pSVar3->val).super_SQObject._unVal.pTable;
      }
      ::SQObjectPtr::operator=((SQObjectPtr *)this_00,(SQObject *)obj);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Get(const SQObjectPtr &key,SQObjectPtr &val) {
        if(_members->Get(key,val)) {
            if(_isfield(val)) {
                SQObjectPtr &o = _defaultvalues[_member_idx(val)].val;
                val = _realval(o);
            }
            else {
                val = _methods[_member_idx(val)].val;
            }
            return true;
        }
        return false;
    }